

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O1

void __thiscall
SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount>::MoveHeadTo
          (SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *this,
          SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *list)

{
  Type pSVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((SListBase<ThunkBlock,_Memory::ArenaAllocator,_RealCount> *)
      (this->super_SListNodeBase<Memory::ArenaAllocator>).next == this) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x1ba,"(!this->Empty())","!this->Empty()");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  pSVar1 = (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (this->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar1->next;
  pSVar1->next = (list->super_SListNodeBase<Memory::ArenaAllocator>).next;
  (list->super_SListNodeBase<Memory::ArenaAllocator>).next = pSVar1;
  (list->super_RealCount).count = (list->super_RealCount).count + 1;
  (this->super_RealCount).count = (this->super_RealCount).count - 1;
  return;
}

Assistant:

void MoveHeadTo(SListBase * list)
    {
        Assert(!this->Empty());
        NodeBase * node = this->Next();
        this->Next() = node->Next();
        node->Next() = list->Next();
        list->Next() = node;

        list->IncrementCount();
        this->DecrementCount();
    }